

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgm_export_obj_triangles(djg_mesh *mesh,char *filename)

{
  FILE *__stream;
  djgm_vertex *pdVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float nrm;
  float n [3];
  djgm_vertex *v;
  FILE *pf;
  int i;
  char *filename_local;
  djg_mesh *mesh_local;
  
  if (mesh == (djg_mesh *)0x0) {
    __assert_fail("mesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                  ,0x738,"bool djgm_export_obj_triangles(const djg_mesh *, const char *)");
  }
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"djg_error: fopen failed\n");
    fflush(_stdout);
    mesh_local._7_1_ = false;
  }
  else {
    fprintf(__stream,"# Created by the DJGM library (see dj_opengl.h)\n\n");
    fprintf(__stream,"# Vertices\n");
    for (pf._4_4_ = 0; pf._4_4_ < mesh->vertexc; pf._4_4_ = pf._4_4_ + 1) {
      pdVar1 = mesh->vertexv + pf._4_4_;
      fVar2 = (pdVar1->dpds).y * (pdVar1->dpdt).z + -((pdVar1->dpds).z * (pdVar1->dpdt).y);
      fVar3 = (pdVar1->dpds).z * (pdVar1->dpdt).x + -((pdVar1->dpds).x * (pdVar1->dpdt).z);
      fVar4 = (pdVar1->dpds).x * (pdVar1->dpdt).y + -((pdVar1->dpds).y * (pdVar1->dpdt).x);
      fVar5 = sqrtf(fVar4 * fVar4 + fVar2 * fVar2 + fVar3 * fVar3);
      if (fVar5 <= 0.0) {
        __assert_fail("nrm > 0.0f && \"Invalid normal\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_opengl/dj_opengl.h"
                      ,0x74f,"bool djgm_export_obj_triangles(const djg_mesh *, const char *)");
      }
      fprintf(__stream,"v %f %f %f\n",(double)(pdVar1->p).x,(double)(pdVar1->p).y,
              (double)(pdVar1->p).z);
      fprintf(__stream,"vn %f %f %f\n",(double)(fVar2 / fVar5),(double)(fVar3 / fVar5),
              (double)(fVar4 / fVar5));
      fprintf(__stream,"vt %f %f\n",(double)(pdVar1->st).s,(double)(pdVar1->st).t);
    }
    fprintf(__stream,"# Topology\n");
    for (pf._4_4_ = 0; pf._4_4_ < mesh->poly3c / 3; pf._4_4_ = pf._4_4_ + 1) {
      fprintf(__stream,"f %i/%i/%i ",(ulong)(mesh->poly3v[pf._4_4_ * 3] + 1),
              (ulong)(mesh->poly3v[pf._4_4_ * 3] + 1),(ulong)(mesh->poly3v[pf._4_4_ * 3] + 1));
      fprintf(__stream,"%i/%i/%i ",(ulong)(mesh->poly3v[pf._4_4_ * 3 + 1] + 1),
              (ulong)(mesh->poly3v[pf._4_4_ * 3 + 1] + 1),
              (ulong)(mesh->poly3v[pf._4_4_ * 3 + 1] + 1));
      fprintf(__stream,"%i/%i/%i\n",(ulong)(mesh->poly3v[pf._4_4_ * 3 + 2] + 1),
              (ulong)(mesh->poly3v[pf._4_4_ * 3 + 2] + 1),
              (ulong)(mesh->poly3v[pf._4_4_ * 3 + 2] + 1));
    }
    fclose(__stream);
    mesh_local._7_1_ = true;
  }
  return mesh_local._7_1_;
}

Assistant:

DJGDEF bool
djgm_export_obj_triangles(const djg_mesh *mesh, const char *filename)
{
    DJG_ASSERT(mesh);
    int i;
    FILE *pf;

    pf = fopen(filename, "w");
    if (!pf) {
        DJG_LOG("djg_error: fopen failed\n");
        return false;
    }
    fprintf(pf, "# Created by the DJGM library (see dj_opengl.h)\n\n");

    // write vertices
    fprintf(pf, "# Vertices\n");
    for (i = 0; i < mesh->vertexc; ++i) {
        const djgm_vertex *v = &mesh->vertexv[i];
        float n[3], nrm;

        // compute the normal from tangent cross product
        n[0] = v->dpds.y * v->dpdt.z - v->dpds.z * v->dpdt.y;
        n[1] = v->dpds.z * v->dpdt.x - v->dpds.x * v->dpdt.z;
        n[2] = v->dpds.x * v->dpdt.y - v->dpds.y * v->dpdt.x;
        nrm = sqrtf(n[0] * n[0] + n[1] * n[1] + n[2] * n[2]);

        DJG_ASSERT(nrm > 0.0f && "Invalid normal");
        fprintf(pf, "v %f %f %f\n", v->p.x, v->p.y, v->p.z);
        fprintf(pf, "vn %f %f %f\n", n[0] / nrm, n[1] / nrm, n[2] / nrm);
        fprintf(pf, "vt %f %f\n", v->st.s, v->st.t);
    }

    // write topology
    fprintf(pf, "# Topology\n");
    for (i = 0; i < mesh->poly3c / 3; ++i) {
        fprintf(pf, "f %i/%i/%i ", (int32_t)mesh->poly3v[3*i  ] + 1,
                                   (int32_t)mesh->poly3v[3*i  ] + 1,
                                   (int32_t)mesh->poly3v[3*i  ] + 1);
        fprintf(pf, "%i/%i/%i ", (int32_t)mesh->poly3v[3*i+1] + 1,
                                 (int32_t)mesh->poly3v[3*i+1] + 1,
                                 (int32_t)mesh->poly3v[3*i+1] + 1);
        fprintf(pf, "%i/%i/%i\n", (int32_t)mesh->poly3v[3*i+2] + 1,
                                  (int32_t)mesh->poly3v[3*i+2] + 1,
                                  (int32_t)mesh->poly3v[3*i+2] + 1);
    }

    fclose(pf);

    return true;
}